

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  uint32_t hash_00;
  uint32_t uVar1;
  Handle *pHVar2;
  uint32_t hash;
  _func_void_Slice_ptr_void_ptr *deleter_local;
  size_t charge_local;
  void *value_local;
  Slice *key_local;
  ShardedLRUCache *this_local;
  
  hash_00 = HashSlice(key);
  uVar1 = Shard(hash_00);
  pHVar2 = LRUCache::Insert(this->shard_ + uVar1,key,hash_00,value,charge,deleter);
  return pHVar2;
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }